

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

SimpleRecurrentLayerParams * __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::New
          (SimpleRecurrentLayerParams *this,Arena *arena)

{
  SimpleRecurrentLayerParams *this_00;
  
  this_00 = (SimpleRecurrentLayerParams *)operator_new(0x48);
  SimpleRecurrentLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::SimpleRecurrentLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

SimpleRecurrentLayerParams* SimpleRecurrentLayerParams::New(::google::protobuf::Arena* arena) const {
  SimpleRecurrentLayerParams* n = new SimpleRecurrentLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}